

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalid_PredictedFeatureNameAndFakeModelInputs(void)

{
  string *psVar1;
  Rep *pRVar2;
  bool bVar3;
  TypeUnion TVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  StringFeatureType *pSVar8;
  DictionaryFeatureType *pDVar9;
  ostream *poVar10;
  ArrayFeatureType *pAVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  void **ppvVar17;
  Model spec;
  FeatureDescription feature;
  string predictedFeatureName;
  string probsName;
  TensorAttributes tensorAttributesOut;
  Result res;
  TensorAttributes tensorAttributesIn;
  Model local_1b8;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  undefined1 local_178 [32];
  string local_158;
  string local_138;
  TensorAttributes local_118;
  pointer local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TensorAttributes local_48;
  
  CoreML::Specification::Model::Model(&local_1b8);
  CoreML::Result::Result((Result *)&local_100);
  local_48.name = "InTensor";
  local_48.dimension = 3;
  local_48._12_4_ = 0;
  local_118.name = "OutTensor";
  local_118.dimension = 1;
  local_118._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_1b8,true,&local_48,&local_118,0x400,false,false);
  local_1b8.specificationversion_ = 4;
  if (local_1b8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_1b8);
    local_1b8._oneof_case_[0] = 500;
    TVar4.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar4.neuralnetwork_);
    local_1b8.Type_.pipelineclassifier_ = TVar4.pipelineclassifier_;
  }
  TVar4 = local_1b8.Type_;
  addSoftmaxLayer(&local_1b8,"softmax","OutTensor","softmax_out");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"predictedFeatures","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"probs","");
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1b8.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1b8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar1 = (pTVar6->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar6->name_,&local_158);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 3;
    pSVar8 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar8);
    (pFVar7->Type_).stringtype_ = pSVar8;
  }
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1b8.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1b8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar1 = (pTVar6->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar6->name_,&local_138);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 6;
    pDVar9 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar9);
    (pFVar7->Type_).dictionarytype_ = pDVar9;
    pFVar7 = pTVar6->type_;
    if (pFVar7 == (FeatureType *)0x0) {
      pFVar7 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar7);
      pTVar6->type_ = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 6) {
    pDVar9 = (pFVar7->Type_).dictionarytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 6;
    pDVar9 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar9);
    (pFVar7->Type_).dictionarytype_ = pDVar9;
  }
  if (pDVar9->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar9);
    pDVar9->_oneof_case_[0] = 2;
    pSVar8 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar8);
    (pDVar9->KeyType_).stringkeytype_ = pSVar8;
  }
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1b8.description_ = pMVar5;
  }
  psVar1 = ((local_1b8.description_)->predictedfeaturename_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_1b8.description_)->predictedfeaturename_,&local_158);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1b8.description_ = pMVar5;
  }
  psVar1 = ((local_1b8.description_)->predictedprobabilitiesname_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_1b8.description_)->predictedprobabilitiesname_,&local_138);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&local_1b8,TVar4.neuralnetwork_,"cross_entropy_loss_layer","softmax_out","target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_a8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_d8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_d8);
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1b8.description_ = pMVar5;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase);
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1b8.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"madeUpInput","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_188);
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,local_178._0_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar11 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar7->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11->datatype_ = 0x10020;
  iVar13 = (pAVar11->shape_).current_size_;
  iVar14 = 3;
  do {
    if (iVar13 == (pAVar11->shape_).total_size_) {
      google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar13 + 1);
      iVar13 = (pAVar11->shape_).current_size_;
    }
    lVar12 = (long)iVar13;
    iVar13 = iVar13 + 1;
    (pAVar11->shape_).current_size_ = iVar13;
    ((pAVar11->shape_).rep_)->elements[lVar12] = 1;
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_1b8.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  psVar1 = (pTVar6->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar6->name_,&local_158);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 3;
    pSVar8 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar8);
    (pFVar7->Type_).stringtype_ = pSVar8;
  }
  CoreML::Model::validate((Result *)local_188,&local_1b8);
  local_100 = (pointer)local_188;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_180);
  if (local_180._M_p != local_178 + 8) {
    operator_delete(local_180._M_p,local_178._8_8_ + 1);
  }
  bVar3 = CoreML::Result::good((Result *)&local_100);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6d3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    iVar13 = 1;
    std::ostream::flush();
  }
  else {
    if (local_1b8.description_ == (ModelDescription *)0x0) {
      pMVar5 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
      local_1b8.description_ = pMVar5;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&((local_1b8.description_)->output_).super_RepeatedPtrFieldBase);
    if (local_1b8.description_ == (ModelDescription *)0x0) {
      pMVar5 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
      local_1b8.description_ = pMVar5;
    }
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&((local_1b8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0)
    ;
    CoreML::Specification::FeatureDescription::set_name(pTVar6,local_118.name);
    pFVar7 = pTVar6->type_;
    if (pFVar7 == (FeatureType *)0x0) {
      pFVar7 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar7);
      pTVar6->type_ = pFVar7;
    }
    if (pFVar7->_oneof_case_[0] == 5) {
      pAVar11 = (pFVar7->Type_).multiarraytype_;
    }
    else {
      CoreML::Specification::FeatureType::clear_Type(pFVar7);
      pFVar7->_oneof_case_[0] = 5;
      pAVar11 = (ArrayFeatureType *)operator_new(0x48);
      CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
      (pFVar7->Type_).multiarraytype_ = pAVar11;
    }
    pAVar11->datatype_ = 0x10020;
    if (0 < local_118.dimension) {
      iVar13 = (pAVar11->shape_).current_size_;
      iVar15 = 0;
      iVar14 = local_118.dimension;
      do {
        if (iVar13 == (pAVar11->shape_).total_size_) {
          google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar13 + 1);
          iVar13 = (pAVar11->shape_).current_size_;
          iVar14 = local_118.dimension;
        }
        lVar12 = (long)iVar13;
        iVar13 = iVar13 + 1;
        (pAVar11->shape_).current_size_ = iVar13;
        ((pAVar11->shape_).rep_)->elements[lVar12] = 1;
        iVar15 = iVar15 + 1;
      } while (iVar15 < iVar14);
    }
    if (local_1b8.description_ == (ModelDescription *)0x0) {
      pMVar5 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
      local_1b8.description_ = pMVar5;
    }
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                        (Type *)0x0);
    local_188 = (undefined1  [8])local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"target","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pTVar6->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (string *)local_188);
    if (local_188 != (undefined1  [8])local_178) {
      operator_delete((void *)local_188,local_178._0_8_ + 1);
    }
    pFVar7 = pTVar6->type_;
    if (pFVar7 == (FeatureType *)0x0) {
      pFVar7 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar7);
      pTVar6->type_ = pFVar7;
    }
    if (pFVar7->_oneof_case_[0] == 5) {
      pAVar11 = (pFVar7->Type_).multiarraytype_;
    }
    else {
      CoreML::Specification::FeatureType::clear_Type(pFVar7);
      pFVar7->_oneof_case_[0] = 5;
      pAVar11 = (ArrayFeatureType *)operator_new(0x48);
      CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
      (pFVar7->Type_).multiarraytype_ = pAVar11;
    }
    pAVar11->datatype_ = 0x20020;
    iVar13 = (pAVar11->shape_).current_size_;
    if (iVar13 == (pAVar11->shape_).total_size_) {
      google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar13 + 1);
      iVar13 = (pAVar11->shape_).current_size_;
    }
    (pAVar11->shape_).current_size_ = iVar13 + 1;
    ((pAVar11->shape_).rep_)->elements[iVar13] = 1;
    pMVar5 = local_1b8.description_;
    if (local_1b8.description_ == (ModelDescription *)0x0) {
      pMVar5 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (pMVar5->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar17 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar17 = (void **)0x0;
    }
    lVar12 = (long)(pMVar5->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar12 != 0) {
      lVar16 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_188,*(FeatureDescription **)((long)ppvVar17 + lVar16)
                  );
        if (local_1b8.description_ == (ModelDescription *)0x0) {
          pMVar5 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
          local_1b8.description_ = pMVar5;
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                            (Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar6,(FeatureDescription *)local_188);
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_188);
        lVar16 = lVar16 + 8;
      } while (lVar12 * 8 != lVar16);
    }
    CoreML::Model::validate((Result *)local_188,&local_1b8);
    local_100 = (pointer)local_188;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_180);
    if (local_180._M_p != local_178 + 8) {
      operator_delete(local_180._M_p,local_178._8_8_ + 1);
    }
    bVar3 = CoreML::Result::good((Result *)&local_100);
    iVar13 = 0;
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6ea);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      iVar13 = 1;
      std::ostream::flush();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_1b8);
  return iVar13;
}

Assistant:

int testInvalid_PredictedFeatureNameAndFakeModelInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    // Model is not a classifier, but we'll describe these things in the spec anyway to check this edge-case
    std::string predictedFeatureName = "predictedFeatures";
    std::string probsName = "probs";
    auto *output = spec.mutable_description()->add_output();
    output->set_name(predictedFeatureName);
    output->mutable_type()->mutable_stringtype();

    auto *outputProbs = spec.mutable_description()->add_output();
    outputProbs->set_name(probsName);
    outputProbs->mutable_type()->mutable_dictionarytype();
    outputProbs->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    spec.mutable_description()->set_predictedfeaturename(predictedFeatureName);
    spec.mutable_description()->set_predictedprobabilitiesname(probsName);


    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", "target");

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto fakeModelInput = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput->set_name("madeUpInput");
    auto fakeModelInputShape = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape->add_shape(1);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(predictedFeatureName);
    trainingInput->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Remove predictedFeatureName from model's outputs and add target and model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}